

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

int pzshape::TPZShapeTetra::NConnectShapeF(int side,int order)

{
  int totsum;
  ostream *poVar1;
  int iVar2;
  int iVar3;
  
  if (side < 4) {
    return 1;
  }
  if ((uint)side < 10) {
    iVar3 = order + -1;
  }
  else if ((uint)side < 0xe) {
    iVar3 = 1;
    if (1 < order) {
      iVar3 = order;
    }
    iVar3 = (int)((ulong)(iVar3 - 2) * (ulong)(iVar3 - 1) >> 1);
  }
  else if (side == 0xe) {
    iVar3 = 0;
    for (iVar2 = 2; iVar2 + -1 < order + -2; iVar2 = iVar2 + 1) {
      iVar3 = iVar3 + ((uint)((iVar2 + -1) * iVar2) >> 1);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "TPZCompElT3d::NConnectShapeF, bad parameter side ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int TPZShapeTetra::NConnectShapeF(int side, int order) {
		if(side<4) return 1;//0 a 3
		//   int s = side-4;
		if(side<10) return order-1;//4 a 9
		if(side<14) {//10 a 13
			int sum = 0;
			for(int i=0;i<order-1;i++) sum += i;
			return sum;
		}
		if(side==14) {
			int totsum = 0,sum;
			for(int i=1;i<order-2;i++) {
				sum = i*(i+1) / 2;
				totsum += sum;
			}
			return totsum;
		}
		PZError << "TPZCompElT3d::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}